

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::WhileStmt> __thiscall
mocker::Parser::whileStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  bool bVar1;
  TokenID TVar2;
  pointer pTVar3;
  __shared_ptr *p_Var4;
  SyntaxError *this_01;
  ASTNode *this_02;
  mapped_type *pmVar5;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Position beg;
  shared_ptr<mocker::ast::WhileStmt> sVar7;
  Position end_00;
  byte local_15d;
  NodeID local_140;
  size_t local_138;
  shared_ptr<mocker::ast::Expression> *psStack_130;
  Token *local_128;
  size_t sStack_120;
  pair<mocker::Position,_mocker::Position> local_110;
  byte local_e9;
  Parser local_e0;
  byte local_c1;
  Parser local_b8;
  Token *local_98;
  undefined1 local_90 [8];
  shared_ptr<mocker::ast::Statement> body;
  shared_ptr<mocker::ast::Expression> condition;
  GetTokenID local_60;
  GetTokenID id;
  size_t local_50;
  undefined1 auStack_38 [8];
  Position begPos;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  begPos.col = (size_t)end._M_current;
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&id,pTVar3);
  auStack_38 = (undefined1  [8])id.end._M_current;
  begPos.line = local_50;
  GetTokenID::GetTokenID(&local_60,in_RCX);
  TVar2 = GetTokenID::operator()(&local_60,*(Token **)begPos.col);
  if (TVar2 == While) {
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)begPos.col);
    std::shared_ptr<mocker::ast::Expression>::shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)
               &body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<mocker::ast::Statement>::shared_ptr
              ((shared_ptr<mocker::ast::Statement> *)local_90);
    local_98 = (Token *)__gnu_cxx::
                        __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                        ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                      *)begPos.col,0);
    local_c1 = 0;
    local_e9 = 0;
    TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_98);
    local_15d = 1;
    if (TVar2 == LeftParen) {
      expression(&local_b8,iter,(TokIter)begPos.col);
      local_c1 = 1;
      p_Var4 = (__shared_ptr *)
               std::shared_ptr<mocker::ast::Expression>::operator=
                         ((shared_ptr<mocker::ast::Expression> *)
                          &body.
                           super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(shared_ptr<mocker::ast::Expression> *)&local_b8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var4);
      local_15d = 1;
      if (bVar1) {
        local_e0.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                        *)__gnu_cxx::
                          __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                          ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                        *)begPos.col,0);
        TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_e0.pos);
        local_15d = 1;
        if (TVar2 == RightParen) {
          statement(&local_e0,iter,(TokIter)begPos.col);
          local_e9 = 1;
          p_Var4 = (__shared_ptr *)
                   std::shared_ptr<mocker::ast::Statement>::operator=
                             ((shared_ptr<mocker::ast::Statement> *)local_90,
                              (shared_ptr<mocker::ast::Statement> *)&local_e0);
          bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var4);
          local_15d = bVar1 ^ 0xff;
        }
      }
    }
    if ((local_e9 & 1) != 0) {
      std::shared_ptr<mocker::ast::Statement>::~shared_ptr
                ((shared_ptr<mocker::ast::Statement> *)&local_e0);
    }
    if ((local_c1 & 1) != 0) {
      std::shared_ptr<mocker::ast::Expression>::~shared_ptr
                ((shared_ptr<mocker::ast::Expression> *)&local_b8);
    }
    if ((local_15d & 1) != 0) {
      this_01 = (SyntaxError *)__cxa_allocate_exception(0x48);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)begPos.col);
      Token::position(&local_110,pTVar3);
      SyntaxError::SyntaxError(this_01,(Position *)auStack_38,&local_110.second);
      __cxa_throw(this_01,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    local_128 = (Token *)auStack_38;
    sStack_120 = begPos.line;
    this_00 = iter[2]._M_current;
    this_02 = &std::
               __shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90)->super_ASTNode;
    local_140 = ast::ASTNode::getID(this_02);
    pmVar5 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                           *)this_00,&local_140);
    local_138 = (pmVar5->second).line;
    psStack_130 = (shared_ptr<mocker::ast::Expression> *)(pmVar5->second).col;
    beg.col = (size_t)local_128;
    beg.line = (size_t)iter;
    end_00.col = local_138;
    end_00.line = sStack_120;
    makeNode<mocker::ast::WhileStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
              (this,beg,end_00,psStack_130,
               (shared_ptr<mocker::ast::Statement> *)
               &body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<mocker::ast::Statement>::~shared_ptr
              ((shared_ptr<mocker::ast::Statement> *)local_90);
    std::shared_ptr<mocker::ast::Expression>::~shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)
               &body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<mocker::ast::WhileStmt>::shared_ptr
              ((shared_ptr<mocker::ast::WhileStmt> *)this,(nullptr_t)0x0);
    _Var6._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::WhileStmt>)
         sVar7.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::WhileStmt> Parser::whileStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::While)
    return nullptr;
  ++iter;
  std::shared_ptr<ast::Expression> condition;
  std::shared_ptr<ast::Statement> body;
  if (id(iter++) != TokenID::LeftParen ||
      !(condition = expression(iter, end)) ||
      id(iter++) != TokenID::RightParen || !(body = statement(iter, end)))
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::WhileStmt>(begPos, pos[body->getID()].second, condition,
                                  body);
}